

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void tr_fixdown(int *ISAd,int *SA,int i,int size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = SA[(uint)i];
  iVar2 = ISAd[iVar1];
  while( true ) {
    iVar6 = i * 2 + 1;
    if (size <= iVar6) break;
    iVar3 = ISAd[SA[iVar6]];
    iVar4 = ISAd[SA[(long)(i * 2) + 2]];
    iVar5 = iVar4;
    if (iVar4 < iVar3) {
      iVar5 = iVar3;
    }
    if (iVar5 <= iVar2) break;
    if (iVar3 < iVar4) {
      iVar6 = i * 2 + 2;
    }
    SA[i] = SA[iVar6];
    i = iVar6;
  }
  SA[i] = iVar1;
  return;
}

Assistant:

static INLINE
void
tr_fixdown(const int *ISAd, int *SA, int i, int size) {
  int j, k;
  int v;
  int c, d, e;

  for(v = SA[i], c = ISAd[v]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = ISAd[SA[k = j++]];
    if(d < (e = ISAd[SA[j]])) { k = j; d = e; }
    if(d <= c) { break; }
  }
  SA[i] = v;
}